

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzterm.c
# Opt level: O1

wchar_t main(wchar_t argc,char **argv)

{
  _Bool utf8_override;
  wchar_t vtmode;
  int iVar1;
  Conf *conf;
  char *linecharset;
  Terminal *term;
  size_t len;
  TermWin termwin;
  char blk [512];
  unicode_data ucsdata;
  TermWin local_1740;
  undefined1 local_1738 [516];
  unicode_data local_1534;
  
  local_1740.vt = &fuzz_termwin_vt;
  conf = conf_new();
  do_defaults((char *)0x0,conf);
  linecharset = conf_get_str(conf,0xa6);
  utf8_override = conf_get_bool(conf,0xa8);
  vtmode = conf_get_int(conf,0xa5);
  init_ucs(&local_1534,linecharset,utf8_override,L'\0',vtmode);
  term = term_init(conf,&local_1534,&local_1740);
  term_size(term,L'\x18',L'P',L'✐');
  term->ldisc = (Ldisc *)0x0;
  iVar1 = feof(_stdin);
  if (iVar1 == 0) {
    do {
      len = fread(local_1738,1,0x200,_stdin);
      term_data(term,local_1738,len);
      iVar1 = feof(_stdin);
    } while (iVar1 == 0);
  }
  term_update(term);
  return L'\0';
}

Assistant:

int main(int argc, char **argv)
{
        char blk[512];
        size_t len;
        Terminal *term;
        Conf *conf;
        struct unicode_data ucsdata;
        TermWin termwin;

        termwin.vt = &fuzz_termwin_vt;

        conf = conf_new();
        do_defaults(NULL, conf);
        init_ucs(&ucsdata, conf_get_str(conf, CONF_line_codepage),
                 conf_get_bool(conf, CONF_utf8_override),
                 CS_NONE, conf_get_int(conf, CONF_vtmode));

        term = term_init(conf, &ucsdata, &termwin);
        term_size(term, 24, 80, 10000);
        term->ldisc = NULL;
        /* Tell american fuzzy lop that this is a good place to fork. */
#ifdef __AFL_HAVE_MANUAL_CONTROL
        __AFL_INIT();
#endif
        while (!feof(stdin)) {
                len = fread(blk, 1, sizeof(blk), stdin);
                term_data(term, blk, len);
        }
        term_update(term);
        return 0;
}